

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::backendNotify
          (QNetworkReplyImplPrivate *this,InternalNotifications notification)

{
  long lVar1;
  bool bVar2;
  __normal_iterator<const_QNetworkReplyImplPrivate::InternalNotifications_*,_std::vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>_>
  __last;
  const_iterator this_00;
  size_type sVar3;
  QEvent *this_01;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImpl *q;
  __normal_iterator<const_QNetworkReplyImplPrivate::InternalNotifications_*,_std::vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>_>
  it;
  __normal_iterator<const_QNetworkReplyImplPrivate::InternalNotifications_*,_std::vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>_>
  *in_stack_ffffffffffffffa8;
  vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_QNetworkReplyImplPrivate::InternalNotifications_*,_std::vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>_>
  __first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current = (InternalNotifications *)in_RDI;
  __last._M_current = (InternalNotifications *)q_func(in_RDI);
  std::
  vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
  ::cbegin(in_stack_ffffffffffffffb0);
  this_00 = std::
            vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
            ::cend(in_stack_ffffffffffffffb0);
  std::
  find<__gnu_cxx::__normal_iterator<QNetworkReplyImplPrivate::InternalNotifications_const*,std::vector<QNetworkReplyImplPrivate::InternalNotifications,std::allocator<QNetworkReplyImplPrivate::InternalNotifications>>>,QNetworkReplyImplPrivate::InternalNotifications>
            (__first,__last,(InternalNotifications *)in_stack_ffffffffffffffb0);
  std::
  vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
  ::cend(in_stack_ffffffffffffffb0);
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<const_QNetworkReplyImplPrivate::InternalNotifications_*,_std::vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>_>
                      *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar2) {
    std::
    vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
    ::push_back((vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
                 *)this_00._M_current,(value_type *)in_RDI);
  }
  sVar3 = std::
          vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
          ::size(&in_RDI->pendingNotifications);
  if (sVar3 == 1) {
    this_01 = (QEvent *)operator_new(0x10);
    QEvent::QEvent(this_01,NetworkReplyUpdated);
    QCoreApplication::postEvent((QObject *)__last._M_current,this_01,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::backendNotify(InternalNotifications notification)
{
    Q_Q(QNetworkReplyImpl);
    const auto it = std::find(pendingNotifications.cbegin(), pendingNotifications.cend(), notification);
    if (it == pendingNotifications.cend())
        pendingNotifications.push_back(notification);

    if (pendingNotifications.size() == 1)
        QCoreApplication::postEvent(q, new QEvent(QEvent::NetworkReplyUpdated));
}